

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ssh_key * eddsa_new_priv(ssh_keyalg *alg,ptrlen pub,ptrlen priv)

{
  ssh_keyalg *psVar1;
  undefined1 local_78 [8];
  BinarySource src [1];
  eddsa_key *ek;
  ssh_key *sshk;
  ssh_keyalg *alg_local;
  ptrlen priv_local;
  ptrlen pub_local;
  
  pub_local.len = (size_t)eddsa_new_pub(alg,pub);
  if ((ssh_key *)pub_local.len == (ssh_key *)0x0) {
    pub_local.len = 0;
  }
  else {
    BinarySource_INIT__((BinarySource *)local_78,priv);
    psVar1 = (ssh_keyalg *)BinarySource_get_mp_le((BinarySource *)src[0]._24_8_);
    ((ssh_key *)(pub_local.len + -8))->vt = psVar1;
  }
  return (ssh_key *)pub_local.len;
}

Assistant:

static ssh_key *eddsa_new_priv(const ssh_keyalg *alg, ptrlen pub, ptrlen priv)
{
    ssh_key *sshk = eddsa_new_pub(alg, pub);
    if (!sshk)
        return NULL;
    struct eddsa_key *ek = container_of(sshk, struct eddsa_key, sshk);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, priv);
    ek->privateKey = get_mp_le(src);

    return &ek->sshk;
}